

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O3

void __thiscall gui::MultilineTextBox::setSizeWithinBounds(MultilineTextBox *this,Vector2f *size)

{
  float *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar2;
  element_type *peVar3;
  TextBoxStyle *this_00;
  uint uVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar7;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  FloatRect FVar8;
  locale local_70 [8];
  String local_68;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  peVar3 = (this->style_).super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::locale::locale(local_70);
  sf::String::String(&local_68,"A",local_70);
  sf::Text::setString(&(peVar3->super_TextBoxStyle).text_,&local_68);
  paVar2 = &local_68.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_68.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(local_70);
  FVar8 = sf::Text::getLocalBounds
                    (&(((this->style_).
                        super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_TextBoxStyle).text_);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = FVar8._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd;
  local_38._8_4_ = in_XMM1_Dc;
  local_38._0_8_ = FVar8._8_8_;
  local_38._12_4_ = in_XMM1_Dd;
  peVar3 = (this->style_).super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::locale::locale(local_70);
  sf::String::String(&local_68,"AA",local_70);
  sf::Text::setString(&(peVar3->super_TextBoxStyle).text_,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_68.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(local_70);
  FVar8 = sf::Text::getLocalBounds
                    (&(((this->style_).
                        super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_TextBoxStyle).text_);
  fVar6 = size->x;
  if ((fVar6 != (this->size_).x) || (NAN(fVar6) || NAN((this->size_).x))) {
    fVar5 = (FVar8.left + FVar8.width) - ((float)local_38._0_4_ + (float)local_48._0_4_);
    fVar7 = (((this->style_).
              super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_TextBoxStyle).textPadding_.x;
    fVar5 = (((fVar6 - (fVar7 + fVar7)) - ((float)local_38._0_4_ + (float)local_48._0_4_)) + fVar5)
            / fVar5;
    fVar6 = 0.0;
    if (0.0 <= fVar5) {
      fVar6 = fVar5;
    }
    local_68.m_string._M_dataplus._M_p =
         (pointer)((long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6);
  }
  else {
    local_68.m_string._M_dataplus._M_p = (pointer)(this->sizeCharacters_).x;
  }
  fVar6 = size->y;
  pfVar1 = &(this->size_).y;
  if ((fVar6 != *pfVar1) || (NAN(fVar6) || NAN(*pfVar1))) {
    this_00 = &((this->style_).
                super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_TextBoxStyle;
    fVar7 = (this_00->textPadding_).y;
    local_38._0_4_ = (this_00->textPadding_).z;
    local_48._0_4_ = fVar6 - (fVar7 + fVar7);
    uVar4 = TextBoxStyle::getCharacterSize(this_00);
    fVar7 = (float)local_48._0_4_ / ((float)uVar4 * (float)local_38._0_4_);
    fVar6 = 0.0;
    if (0.0 <= fVar7) {
      fVar6 = fVar7;
    }
    local_68.m_string._M_string_length =
         (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6;
  }
  else {
    local_68.m_string._M_string_length = (this->sizeCharacters_).y;
  }
  setSizeCharacters(this,(Vector2<unsigned_long> *)&local_68);
  return;
}

Assistant:

void MultilineTextBox::setSizeWithinBounds(const sf::Vector2f& size) {
    style_->text_.setString("A");
    const auto bounds1 = style_->text_.getLocalBounds();
    style_->text_.setString("AA");
    const auto bounds2 = style_->text_.getLocalBounds();

    // The first character may have some extra spacing, so figure out the actual width of each one.
    const auto charWidthFirst = bounds1.left + bounds1.width;
    const auto charWidth = bounds2.left + bounds2.width - charWidthFirst;

    sf::Vector2<size_t> sizeCharacters;
    if (size.x == size_.x) {
        sizeCharacters.x = sizeCharacters_.x;
    } else {
        sizeCharacters.x = static_cast<size_t>(std::max((size.x - 2.0f * style_->textPadding_.x - charWidthFirst + charWidth) / charWidth, 0.0f));
    }
    if (size.y == size_.y) {
        sizeCharacters.y = sizeCharacters_.y;
    } else {
        sizeCharacters.y = static_cast<size_t>(std::max((size.y - 2.0f * style_->textPadding_.y) / (style_->textPadding_.z * style_->getCharacterSize()), 0.0f));
    }
    setSizeCharacters(sizeCharacters);
}